

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int m_flush_block(aec_stream *strm)

{
  internal_state *piVar1;
  long lVar2;
  code *pcVar3;
  
  piVar1 = strm->state;
  if (piVar1->direct_out == 0) {
    piVar1->i = 0;
    pcVar3 = m_flush_block_resumable;
  }
  else {
    lVar2 = (long)(*(int *)&piVar1->cds - (int)strm->next_out);
    strm->next_out = strm->next_out + lVar2;
    strm->avail_out = strm->avail_out - lVar2;
    pcVar3 = m_get_block;
  }
  piVar1->mode = pcVar3;
  return (int)piVar1;
}

Assistant:

static int m_flush_block(struct aec_stream *strm)
{
    /**
       Flush block in direct_out mode by updating counters.

       Fall back to slow flushing if in buffered mode.
    */
    int n;
    struct internal_state *state = strm->state;

#ifdef ENABLE_RSI_PADDING
    if (state->blocks_avail == 0
        && strm->flags & AEC_PAD_RSI
        && state->block_nonzero == 0
        )
        emit(state, 0, state->bits % 8);
#endif

    if (state->direct_out) {
        n = (int)(state->cds - strm->next_out);
        strm->next_out += n;
        strm->avail_out -= n;
        state->mode = m_get_block;
        return M_CONTINUE;
    }

    state->i = 0;
    state->mode = m_flush_block_resumable;
    return M_CONTINUE;
}